

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O2

void __thiscall FIX::DataDictionary::checkValue(DataDictionary *this,FieldBase *field)

{
  int field_00;
  IncorrectTagValue *this_00;
  bool bVar1;
  allocator<char> local_41;
  string local_40;
  
  bVar1 = hasFieldValue(this,field->m_tag);
  if (bVar1) {
    bVar1 = isFieldValue(this,field->m_tag,&field->m_string);
    if (!bVar1) {
      this_00 = (IncorrectTagValue *)__cxa_allocate_exception(0x58);
      field_00 = field->m_tag;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
      IncorrectTagValue::IncorrectTagValue(this_00,field_00,&local_40);
      __cxa_throw(this_00,&IncorrectTagValue::typeinfo,Exception::~Exception);
    }
  }
  return;
}

Assistant:

EXCEPT(IncorrectTagValue) {
    if (!hasFieldValue(field.getTag())) {
      return;
    }

    const std::string &value = field.getString();
    if (!isFieldValue(field.getTag(), value)) {
      throw IncorrectTagValue(field.getTag());
    }
  }